

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O0

void __thiscall QAbstractButton::setText(QAbstractButton *this,QString *text)

{
  bool bVar1;
  QAbstractButtonPrivate *this_00;
  QKeySequence *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QAbstractButtonPrivate *d;
  QKeySequence newMnemonic;
  QAccessibleEvent event;
  QWidget *this_01;
  QSize local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QAbstractButton *)0x4ffbfe);
  bVar1 = ::operator==((QString *)this_00,(QString *)in_RDI);
  if (!bVar1) {
    QString::operator=(&this_00->text,(QString *)in_RSI);
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QKeySequence::mnemonic((QString *)&local_30);
    setShortcut((QAbstractButton *)this_01,in_RSI);
    QSize::QSize((QSize *)this_00);
    this_00->sizeHint = local_38;
    QWidget::update(in_RDI);
    QWidget::updateGeometry((QWidget *)this_00);
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessibleEvent::QAccessibleEvent
              ((QAccessibleEvent *)&local_28,&in_RDI->super_QObject,NameChanged);
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
    QKeySequence::~QKeySequence((QKeySequence *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::setText(const QString &text)
{
    Q_D(QAbstractButton);
    if (d->text == text)
        return;
    d->text = text;
#ifndef QT_NO_SHORTCUT
    QKeySequence newMnemonic = QKeySequence::mnemonic(text);
    setShortcut(newMnemonic);
#endif
    d->sizeHint = QSize();
    update();
    updateGeometry();
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::NameChanged);
    QAccessible::updateAccessibility(&event);
#endif
}